

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::merge
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          data_node_type *leaf,int key)

{
  longlong *plVar1;
  TraversalNode *pTVar2;
  TraversalNode *pTVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  uint8_t uVar6;
  byte bVar7;
  double dVar8;
  self_type *psVar9;
  AlexNode<int,_int> *pAVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  TraversalNode TVar13;
  TraversalNode TVar14;
  iterator iVar15;
  model_node_type *pmVar16;
  ulong uVar17;
  self_type **ppsVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  model_node_type *node;
  data_node_type *pdVar24;
  data_node_type *pdVar25;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  data_node_type *unaff_RBP;
  self_type *psVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  model_node_type *node_3;
  AlexNode<int,_int> *node_00;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  traversal_path;
  void *local_78;
  iterator iStack_70;
  TraversalNode *local_68;
  TraversalNode local_60;
  int local_4c;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_48;
  double local_40;
  double local_38;
  
  local_68 = (TraversalNode *)0x0;
  local_78 = (void *)0x0;
  iStack_70._M_current = (TraversalNode *)0x0;
  local_60.node = this->superroot_;
  local_60.bucketID = 0;
  local_4c = key;
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
  ::
  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              *)&local_78,(iterator)0x0,&local_60);
  pdVar25 = (data_node_type *)this->root_node_;
  pdVar24 = pdVar25;
  local_48 = this;
  if ((pdVar25->super_AlexNode<int,_int>).is_leaf_ == false) {
    local_40 = (double)local_4c;
    do {
      auVar32._8_8_ = 0;
      auVar32._0_8_ = (pdVar25->super_AlexNode<int,_int>).model_.a_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_40;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pdVar25->super_AlexNode<int,_int>).model_.b_;
      auVar5 = vfmadd213sd_fma(auVar32,auVar31,auVar5);
      uVar23 = *(int *)&pdVar25->allocator_ - 1;
      local_38 = auVar5._0_8_;
      uVar19 = ~((int)local_38 >> 0x1f) & (int)local_38;
      if ((int)uVar19 <= (int)uVar23) {
        uVar23 = uVar19;
      }
      local_60.node = (model_node_type *)pdVar25;
      local_60.bucketID = uVar23;
      if (iStack_70._M_current == local_68) {
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
        ::
        _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                    *)&local_78,iStack_70,&local_60);
      }
      else {
        (iStack_70._M_current)->node = (model_node_type *)pdVar25;
        *(ulong *)&(iStack_70._M_current)->bucketID = CONCAT44(local_60._12_4_,uVar23);
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      iVar15._M_current = iStack_70._M_current;
      pdVar25 = (data_node_type *)
                (&(pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar23];
      bVar11 = (pdVar25->super_AlexNode<int,_int>).is_leaf_;
      if (bVar11 == true) {
        plVar1 = &(local_48->stats_).num_node_lookups;
        *plVar1 = *plVar1 + (long)(pdVar25->super_AlexNode<int,_int>).level_;
        auVar5 = vcvtdq2pd_avx(ZEXT416((uint)(int)(local_38 + 0.5)));
        auVar12._8_8_ = 0x7fffffffffffffff;
        auVar12._0_8_ = 0x7fffffffffffffff;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_38 - auVar5._0_8_;
        auVar31 = vandpd_avx512vl(auVar33,auVar12);
        pdVar24 = pdVar25;
        if (local_38 * 2.220446049250313e-15 < auVar31._0_8_) break;
        unaff_RBP = pdVar25;
        if (auVar5._0_8_ <= local_38) {
          psVar26 = pdVar25->prev_leaf_;
          if (psVar26 == (self_type *)0x0) break;
          uVar17 = (ulong)(uint)psVar26->data_capacity_;
          do {
            if ((int)uVar17 < 1) {
              iVar29 = -0x80000000;
              goto LAB_0013f72f;
            }
            uVar23 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar23;
          } while ((psVar26->bitmap_[uVar23 >> 6] >> (uVar17 & 0x3f) & 1) == 0);
          iVar29 = psVar26->key_slots_[uVar23];
LAB_0013f72f:
          if (local_4c <= iVar29) {
            uVar23 = iStack_70._M_current[-1].bucketID;
            uVar19 = (int)uVar23 %
                     (1 << ((pdVar25->super_AlexNode<int,_int>).duplication_factor_ & 0x1f));
            if (uVar23 != uVar19) {
              iVar29 = uVar23 + ~uVar19;
              goto LAB_0013f905;
            }
            pTVar2 = iStack_70._M_current + -1;
            pmVar16 = pTVar2->node;
            do {
              pTVar3 = iStack_70._M_current + -1;
              bVar7 = (pmVar16->super_AlexNode<int,_int>).duplication_factor_;
              iVar15._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
              pTVar2->node = iStack_70._M_current[-2].node;
              uVar23 = iVar15._M_current[-1].bucketID;
              uVar19 = (int)uVar23 % (1 << (bVar7 & 0x1f));
              pmVar16 = iVar15._M_current[-1].node;
              iStack_70._M_current = pTVar3;
            } while (uVar23 == uVar19);
            iVar29 = uVar23 + ~uVar19;
            iVar15._M_current[-1].bucketID = iVar29;
            pdVar24 = (data_node_type *)pmVar16->children_[iVar29];
            if ((pdVar24->super_AlexNode<int,_int>).is_leaf_ == false) {
              do {
                local_60.bucketID = *(int *)&pdVar24->allocator_ - 1;
                local_60.node = (model_node_type *)pdVar24;
                if (iStack_70._M_current == local_68) {
                  std::
                  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                  ::
                  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                              *)&local_78,iStack_70,&local_60);
                }
                else {
                  TVar13.bucketID = local_60.bucketID;
                  TVar13.node = (model_node_type *)pdVar24;
                  TVar13._12_4_ = local_60._12_4_;
                  *iStack_70._M_current = TVar13;
                  iStack_70._M_current = iStack_70._M_current + 1;
                }
                pdVar24 = *(data_node_type **)
                           ((long)pdVar24->next_leaf_ + (long)*(int *)&pdVar24->allocator_ * 8 + -8)
                ;
              } while ((pdVar24->super_AlexNode<int,_int>).is_leaf_ != true);
            }
            unaff_RBP = pdVar25->prev_leaf_;
            if (pdVar24 != unaff_RBP) goto LAB_0013fb01;
          }
        }
        else {
          psVar26 = pdVar25->next_leaf_;
          if (psVar26 == (self_type *)0x0) break;
          iVar29 = 0x7fffffff;
          if (0 < psVar26->data_capacity_) {
            uVar17 = 0;
            do {
              if ((psVar26->bitmap_[uVar17 >> 6 & 0x3ffffff] >> (uVar17 & 0x3f) & 1) != 0) {
                iVar29 = psVar26->key_slots_[uVar17];
                break;
              }
              uVar17 = uVar17 + 1;
            } while (psVar26->data_capacity_ != (int)uVar17);
          }
          if (iVar29 <= local_4c) {
            pmVar16 = iStack_70._M_current[-1].node;
            iVar29 = 1 << ((pdVar25->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
            iVar29 = (iStack_70._M_current[-1].bucketID - iStack_70._M_current[-1].bucketID % iVar29
                     ) + iVar29;
            if (iVar29 == pmVar16->num_children_) {
              pTVar2 = iStack_70._M_current + -1;
              do {
                pTVar3 = iStack_70._M_current + -1;
                iVar29 = 1 << ((pmVar16->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
                iVar15._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
                pTVar2->node = iStack_70._M_current[-2].node;
                pmVar16 = iVar15._M_current[-1].node;
                iVar29 = (iVar15._M_current[-1].bucketID + iVar29) -
                         iVar15._M_current[-1].bucketID % iVar29;
                iStack_70._M_current = pTVar3;
              } while (iVar29 == pmVar16->num_children_);
              iVar15._M_current[-1].bucketID = iVar29;
              pdVar24 = (data_node_type *)pmVar16->children_[iVar29];
              if ((pdVar24->super_AlexNode<int,_int>).is_leaf_ == false) {
                do {
                  local_60.bucketID = 0;
                  local_60.node = (model_node_type *)pdVar24;
                  if (iStack_70._M_current == local_68) {
                    std::
                    vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                    ::
                    _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                              ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                                *)&local_78,iStack_70,&local_60);
                  }
                  else {
                    TVar14.bucketID = 0;
                    TVar14.node = (model_node_type *)pdVar24;
                    TVar14._12_4_ = local_60._12_4_;
                    *iStack_70._M_current = TVar14;
                    iStack_70._M_current = iStack_70._M_current + 1;
                  }
                  pdVar24 = (data_node_type *)
                            (pdVar24->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
                } while ((pdVar24->super_AlexNode<int,_int>).is_leaf_ != true);
              }
              unaff_RBP = pdVar25->next_leaf_;
              if (pdVar24 != pdVar25->next_leaf_) goto LAB_0013fa0f;
            }
            else {
LAB_0013f905:
              iStack_70._M_current[-1].bucketID = iVar29;
              unaff_RBP = psVar26;
            }
          }
        }
      }
      pdVar24 = unaff_RBP;
    } while (bVar11 == false);
  }
  this_00 = local_48;
  iVar15._M_current = iStack_70._M_current;
  if (pdVar24 != leaf) {
    if (pdVar24->prev_leaf_ == leaf) {
      uVar23 = iStack_70._M_current[-1].bucketID;
      uVar19 = (int)uVar23 % (1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f));
      if (uVar23 == uVar19) {
        pTVar2 = iStack_70._M_current + -1;
        pmVar16 = pTVar2->node;
        do {
          pTVar3 = iStack_70._M_current + -1;
          bVar7 = (pmVar16->super_AlexNode<int,_int>).duplication_factor_;
          iVar15._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
          pTVar2->node = iStack_70._M_current[-2].node;
          uVar23 = iVar15._M_current[-1].bucketID;
          uVar19 = (int)uVar23 % (1 << (bVar7 & 0x1f));
          pmVar16 = iVar15._M_current[-1].node;
          iStack_70._M_current = pTVar3;
        } while (uVar23 == uVar19);
        iVar29 = uVar23 + ~uVar19;
        iVar15._M_current[-1].bucketID = iVar29;
        pdVar25 = (data_node_type *)pmVar16->children_[iVar29];
        if ((pdVar25->super_AlexNode<int,_int>).is_leaf_ == false) {
          do {
            local_60.bucketID = *(int *)&pdVar25->allocator_ - 1;
            local_60.node = (model_node_type *)pdVar25;
            if (iStack_70._M_current == local_68) {
              std::
              vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              ::
              _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                        ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                          *)&local_78,iStack_70,&local_60);
            }
            else {
              (iStack_70._M_current)->node = (model_node_type *)pdVar25;
              *(ulong *)&(iStack_70._M_current)->bucketID =
                   CONCAT44(local_60._12_4_,local_60.bucketID);
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            pdVar25 = *(data_node_type **)
                       ((long)pdVar25->next_leaf_ + (long)*(int *)&pdVar25->allocator_ * 8 + -8);
          } while ((pdVar25->super_AlexNode<int,_int>).is_leaf_ != true);
        }
        if (pdVar25 != leaf->prev_leaf_) {
LAB_0013fb01:
          __assert_fail("cur == leaf->prev_leaf_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x1fc,
                        "void alex::Alex<int, int>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        goto LAB_0013fb27;
      }
      iVar29 = uVar23 + ~uVar19;
    }
    else {
      if (pdVar24->next_leaf_ != leaf) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x8ca,
                      "void alex::Alex<int, int>::merge(data_node_type *, T) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      pmVar16 = iStack_70._M_current[-1].node;
      iVar29 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      iVar29 = (iStack_70._M_current[-1].bucketID - iStack_70._M_current[-1].bucketID % iVar29) +
               iVar29;
      if (iVar29 == pmVar16->num_children_) {
        pTVar2 = iStack_70._M_current + -1;
        do {
          pTVar3 = iStack_70._M_current + -1;
          iVar29 = 1 << ((pmVar16->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
          iVar15._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
          pTVar2->node = iStack_70._M_current[-2].node;
          pmVar16 = iVar15._M_current[-1].node;
          iVar29 = (iVar15._M_current[-1].bucketID + iVar29) -
                   iVar15._M_current[-1].bucketID % iVar29;
          iStack_70._M_current = pTVar3;
        } while (iVar29 == pmVar16->num_children_);
        iVar15._M_current[-1].bucketID = iVar29;
        pdVar25 = (data_node_type *)pmVar16->children_[iVar29];
        if ((pdVar25->super_AlexNode<int,_int>).is_leaf_ == false) {
          do {
            local_60.bucketID = 0;
            local_60.node = (model_node_type *)pdVar25;
            if (iStack_70._M_current == local_68) {
              std::
              vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              ::
              _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                        ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                          *)&local_78,iStack_70,&local_60);
            }
            else {
              (iStack_70._M_current)->node = (model_node_type *)pdVar25;
              *(ulong *)&(iStack_70._M_current)->bucketID = (ulong)(uint)local_60._12_4_ << 0x20;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            pdVar25 = (data_node_type *)
                      (pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
          } while ((pdVar25->super_AlexNode<int,_int>).is_leaf_ != true);
        }
        this_00 = local_48;
        if (pdVar25 != leaf->next_leaf_) {
LAB_0013fa0f:
          __assert_fail("cur == leaf->next_leaf_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x217,
                        "void alex::Alex<int, int>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        goto LAB_0013fb27;
      }
    }
    iStack_70._M_current[-1].bucketID = iVar29;
  }
LAB_0013fb27:
  uVar17 = (long)iStack_70._M_current - (long)local_78;
  if ((uVar17 != 0x10) && (uVar23 = (uint)(uVar17 >> 4), 0 < (int)uVar23)) {
    iVar28 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
    lVar22 = ((long)(uVar17 * 0x10000000 + -0x100000000) >> 0x20) * 0x10;
    iVar29 = *(int *)((long)local_78 + lVar22 + 8);
    node_00 = *(AlexNode<int,_int> **)((long)local_78 + lVar22);
    lVar22 = (ulong)(uVar23 & 0x7fffffff) - 1;
    do {
      iVar20 = leaf->num_keys_;
      while ((iVar20 == 0 &&
             (iVar20._0_1_ = node_00[1].is_leaf_, iVar20._1_1_ = node_00[1].duplication_factor_,
             iVar20._2_2_ = node_00[1].level_, iVar28 < iVar20))) {
        iVar20 = iVar29 % iVar28;
        iVar21 = iVar29 % (iVar28 * 2);
        dVar8 = node_00[1].model_.a_;
        lVar27 = (long)(iVar29 - iVar20);
        lVar30 = (long)((iVar29 - iVar20) + iVar28);
        if (iVar21 == iVar20) {
          psVar26 = *(self_type **)((long)dVar8 + lVar30 * 8);
          if ((psVar26->super_AlexNode<int,_int>).is_leaf_ == false) break;
        }
        else {
          psVar26 = *(self_type **)((long)dVar8 + -8 + lVar27 * 8);
          if ((psVar26->super_AlexNode<int,_int>).is_leaf_ != true) break;
        }
        uVar6 = (leaf->super_AlexNode<int,_int>).duplication_factor_;
        if (uVar6 != (psVar26->super_AlexNode<int,_int>).duplication_factor_) break;
        if (0 < iVar28) {
          do {
            *(self_type **)((long)node_00[1].model_.a_ + lVar27 * 8) = psVar26;
            lVar27 = lVar27 + 1;
          } while (lVar27 < lVar30);
        }
        if (iVar21 == iVar20) {
          psVar9 = leaf->prev_leaf_;
          psVar26->prev_leaf_ = psVar9;
          if (psVar9 != (self_type *)0x0) {
            ppsVar18 = &psVar9->next_leaf_;
LAB_0013fc27:
            *ppsVar18 = psVar26;
          }
        }
        else {
          psVar9 = leaf->next_leaf_;
          psVar26->next_leaf_ = psVar9;
          if (psVar9 != (self_type *)0x0) {
            ppsVar18 = &psVar9->prev_leaf_;
            goto LAB_0013fc27;
          }
        }
        (psVar26->super_AlexNode<int,_int>).duplication_factor_ = uVar6 + '\x01';
        delete_node(this_00,&leaf->super_AlexNode<int,_int>);
        piVar4 = &(this_00->stats_).num_data_nodes;
        *piVar4 = *piVar4 + -1;
        iVar20 = psVar26->num_keys_;
        leaf = psVar26;
        iVar28 = 1 << ((psVar26->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      }
      iVar29._0_1_ = node_00[1].is_leaf_;
      iVar29._1_1_ = node_00[1].duplication_factor_;
      iVar29._2_2_ = node_00[1].level_;
      if (iVar28 != iVar29) break;
      bVar7 = node_00->duplication_factor_;
      (leaf->super_AlexNode<int,_int>).duplication_factor_ = bVar7;
      pAVar10 = this_00->root_node_;
      delete_node(this_00,node_00);
      piVar4 = &(this_00->stats_).num_model_nodes;
      *piVar4 = *piVar4 + -1;
      if (node_00 == pAVar10) {
        local_48->root_node_ = &leaf->super_AlexNode<int,_int>;
        *local_48->superroot_->children_ = &leaf->super_AlexNode<int,_int>;
        (local_48->superroot_->super_AlexNode<int,_int>).level_ =
             (leaf->super_AlexNode<int,_int>).level_ + -1;
        break;
      }
      lVar27 = (lVar22 + -1) * 0x10;
      iVar28 = 1 << (bVar7 & 0x1f);
      node_00 = *(AlexNode<int,_int> **)((long)local_78 + lVar27);
      iVar29 = *(int *)((long)local_78 + lVar27 + 8);
      if (bVar7 != 0x1f) {
        iVar20 = iVar29 - iVar29 % iVar28;
        lVar27 = (long)iVar20;
        do {
          *(data_node_type **)((long)node_00[1].model_.a_ + lVar27 * 8) = leaf;
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar20 + iVar28);
      }
      bVar11 = 0 < lVar22;
      lVar22 = lVar22 + -1;
      this_00 = local_48;
    } while (bVar11);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void merge(data_node_type* leaf, T key) {
    // first save the complete path down to data node
    std::vector<TraversalNode> traversal_path;
    auto leaf_dup = get_leaf(key, &traversal_path);
    // We might need to correct the traversal path in edge cases
    if (leaf_dup != leaf) {
      if (leaf_dup->prev_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, true);
      } else if (leaf_dup->next_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, false);
      } else {
        assert(false);
        return;
      }
    }
    if (traversal_path.size() == 1) {
      return;
    }
    int path_pos = static_cast<int>(traversal_path.size()) - 1;
    TraversalNode tn = traversal_path[path_pos];
    model_node_type* parent = tn.node;
    int bucketID = tn.bucketID;
    int repeats = 1 << leaf->duplication_factor_;

    while (path_pos >= 0) {
      // repeatedly merge leaf with "sibling" leaf by redirecting pointers in
      // the parent
      while (leaf->num_keys_ == 0 && repeats < parent->num_children_) {
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        // determine if the potential sibling leaf is adjacent to the right or
        // left
        bool adjacent_to_right =
            (bucketID % (repeats << 1) == bucketID % repeats);
        data_node_type* adjacent_leaf = nullptr;

        // check if adjacent node is a leaf
        if (adjacent_to_right && parent->children_[end_bucketID]->is_leaf_) {
          adjacent_leaf =
              static_cast<data_node_type*>(parent->children_[end_bucketID]);
        } else if (!adjacent_to_right &&
                   parent->children_[start_bucketID - 1]->is_leaf_) {
          adjacent_leaf = static_cast<data_node_type*>(
              parent->children_[start_bucketID - 1]);
        } else {
          break;  // unable to merge with sibling leaf
        }

        // check if adjacent node is a sibling
        if (leaf->duplication_factor_ != adjacent_leaf->duplication_factor_) {
          break;  // unable to merge with sibling leaf
        }

        // merge with adjacent leaf
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = adjacent_leaf;
        }
        if (adjacent_to_right) {
          adjacent_leaf->prev_leaf_ = leaf->prev_leaf_;
          if (leaf->prev_leaf_) {
            leaf->prev_leaf_->next_leaf_ = adjacent_leaf;
          }
        } else {
          adjacent_leaf->next_leaf_ = leaf->next_leaf_;
          if (leaf->next_leaf_) {
            leaf->next_leaf_->prev_leaf_ = adjacent_leaf;
          }
        }
        adjacent_leaf->duplication_factor_++;
        delete_node(leaf);
        stats_.num_data_nodes--;
        leaf = adjacent_leaf;
        repeats = 1 << leaf->duplication_factor_;
      }

      // try to merge up by removing parent and replacing pointers to parent
      // with pointers to leaf in grandparent
      if (repeats == parent->num_children_) {
        leaf->duplication_factor_ = parent->duplication_factor_;
        repeats = 1 << leaf->duplication_factor_;
        bool is_root_node = (parent == root_node_);
        delete_node(parent);
        stats_.num_model_nodes--;

        if (is_root_node) {
          root_node_ = leaf;
          update_superroot_pointer();
          break;
        }

        path_pos--;
        tn = traversal_path[path_pos];
        parent = tn.node;
        bucketID = tn.bucketID;
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = leaf;
        }
      } else {
        break;  // unable to merge up
      }
    }
  }